

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Color ColorBrightness(Color color,float factor)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = 1.0;
  if ((factor <= 1.0) && (fVar2 = factor, factor < -1.0)) {
    fVar2 = -1.0;
  }
  fVar1 = (float)((uint)color & 0xff);
  fVar3 = (float)((uint)color >> 8 & 0xff);
  fVar4 = (float)((uint)color >> 0x10 & 0xff);
  if (0.0 <= fVar2) {
    fVar1 = fVar1 + (255.0 - fVar1) * fVar2;
    fVar3 = fVar3 + (255.0 - fVar3) * fVar2;
    fVar2 = (255.0 - fVar4) * fVar2 + fVar4;
  }
  else {
    fVar2 = fVar2 + 1.0;
    fVar1 = fVar1 * fVar2;
    fVar3 = fVar3 * fVar2;
    fVar2 = fVar2 * fVar4;
  }
  return (Color)((int)fVar1 & 0xffU |
                ((int)fVar3 & 0xffU) << 8 | ((int)fVar2 & 0xffU) << 0x10 | (uint)color & 0xff000000)
  ;
}

Assistant:

Color ColorBrightness(Color color, float factor)
{
    Color result = color;

    if (factor > 1.0f) factor = 1.0f;
    else if (factor < -1.0f) factor = -1.0f;

    float red = (float)color.r;
    float green = (float)color.g;
    float blue = (float)color.b;

    if (factor < 0.0f)
    {
        factor = 1.0f + factor;
        red *= factor;
        green *= factor;
        blue *= factor;
    }
    else
    {
        red = (255 - red)*factor + red;
        green = (255 - green)*factor + green;
        blue = (255 - blue)*factor + blue;
    }

    result.r = (unsigned char)red;
    result.g = (unsigned char)green;
    result.b = (unsigned char)blue;

    return result;
}